

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pic_is4(stbi__context *s,char *str)

{
  stbi_uc sVar1;
  stbi_uc *psVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    psVar2 = s->img_buffer;
    if (psVar2 < s->img_buffer_end) {
LAB_0011c00d:
      s->img_buffer = psVar2 + 1;
      sVar1 = *psVar2;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        psVar2 = s->img_buffer;
        goto LAB_0011c00d;
      }
      sVar1 = '\0';
    }
    if (sVar1 != str[lVar3]) {
      return 0;
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 4) {
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__pic_is4(stbi__context *s,const char *str)
{
   int i;
   for (i=0; i<4; ++i)
      if (stbi__get8(s) != (stbi_uc)str[i])
         return 0;

   return 1;
}